

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatienceSort.h
# Opt level: O0

void __thiscall
PatienceSorting<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>::
BlindMerge(PatienceSorting<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
           *this,array<std::vector<int,_std::allocator<int>_>_*,_2UL> *arrs,ValueVector *write,
          iterator cur_run,size_t arr_index)

{
  int iVar1;
  value_type vVar2;
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  size_t sVar3;
  _List_iterator<RunInfo> _Var4;
  pointer pRVar5;
  reference ppvVar6;
  reference pvVar7;
  bool bVar8;
  ulong local_78;
  size_t i_1;
  size_t i;
  ValueVector *next_arr;
  ValueVector *curr_arr;
  size_t k;
  size_t two;
  size_t one;
  _List_iterator<RunInfo> local_38;
  _List_iterator<RunInfo> next_run;
  size_t arr_index_local;
  ValueVector *write_local;
  array<std::vector<int,_std::allocator<int>_>_*,_2UL> *arrs_local;
  PatienceSorting<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *this_local;
  iterator cur_run_local;
  
  next_run._M_node = (_List_node_base *)arr_index;
  this_local = (PatienceSorting<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                *)cur_run._M_node;
  local_38 = std::next<std::_List_iterator<RunInfo>>(cur_run._M_node,1);
  pRVar5 = std::_List_iterator<RunInfo>::operator->((_List_iterator<RunInfo> *)&this_local);
  two = pRVar5->elem_index;
  pRVar5 = std::_List_iterator<RunInfo>::operator->(&local_38);
  k = pRVar5->elem_index;
  pRVar5 = std::_List_iterator<RunInfo>::operator->((_List_iterator<RunInfo> *)&this_local);
  curr_arr = (ValueVector *)pRVar5->elem_index;
  pRVar5 = std::_List_iterator<RunInfo>::operator->((_List_iterator<RunInfo> *)&this_local);
  ppvVar6 = std::array<std::vector<int,_std::allocator<int>_>_*,_2UL>::operator[]
                      (arrs,pRVar5->array_index);
  this_00 = *ppvVar6;
  pRVar5 = std::_List_iterator<RunInfo>::operator->(&local_38);
  ppvVar6 = std::array<std::vector<int,_std::allocator<int>_>_*,_2UL>::operator[]
                      (arrs,pRVar5->array_index);
  this_01 = *ppvVar6;
  while( true ) {
    pRVar5 = std::_List_iterator<RunInfo>::operator->((_List_iterator<RunInfo> *)&this_local);
    sVar3 = pRVar5->elem_index;
    pRVar5 = std::_List_iterator<RunInfo>::operator->((_List_iterator<RunInfo> *)&this_local);
    bVar8 = false;
    if (two - sVar3 < pRVar5->run_size) {
      pRVar5 = std::_List_iterator<RunInfo>::operator->(&local_38);
      sVar3 = pRVar5->elem_index;
      pRVar5 = std::_List_iterator<RunInfo>::operator->(&local_38);
      bVar8 = k - sVar3 < pRVar5->run_size;
    }
    if (!bVar8) break;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](this_00,two);
    iVar1 = *pvVar7;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](this_01,k);
    if (iVar1 < *pvVar7) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](this_00,two);
      vVar2 = *pvVar7;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](write,(size_type)curr_arr);
      *pvVar7 = vVar2;
      two = two + 1;
    }
    else {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](this_01,k);
      vVar2 = *pvVar7;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](write,(size_type)curr_arr);
      *pvVar7 = vVar2;
      k = k + 1;
    }
    curr_arr = (ValueVector *)
               ((long)&(curr_arr->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start + 1);
  }
  pRVar5 = std::_List_iterator<RunInfo>::operator->((_List_iterator<RunInfo> *)&this_local);
  sVar3 = pRVar5->elem_index;
  pRVar5 = std::_List_iterator<RunInfo>::operator->((_List_iterator<RunInfo> *)&this_local);
  if (two - sVar3 < pRVar5->run_size) {
    pRVar5 = std::_List_iterator<RunInfo>::operator->((_List_iterator<RunInfo> *)&this_local);
    for (i_1 = two - pRVar5->elem_index;
        pRVar5 = std::_List_iterator<RunInfo>::operator->((_List_iterator<RunInfo> *)&this_local),
        i_1 < pRVar5->run_size; i_1 = i_1 + 1) {
      pRVar5 = std::_List_iterator<RunInfo>::operator->((_List_iterator<RunInfo> *)&this_local);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](this_00,i_1 + pRVar5->elem_index);
      vVar2 = *pvVar7;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](write,(size_type)curr_arr);
      *pvVar7 = vVar2;
      curr_arr = (ValueVector *)
                 ((long)&(curr_arr->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start + 1);
    }
  }
  else {
    pRVar5 = std::_List_iterator<RunInfo>::operator->(&local_38);
    for (local_78 = k - pRVar5->elem_index;
        pRVar5 = std::_List_iterator<RunInfo>::operator->(&local_38), local_78 < pRVar5->run_size;
        local_78 = local_78 + 1) {
      pRVar5 = std::_List_iterator<RunInfo>::operator->(&local_38);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         (this_01,local_78 + pRVar5->elem_index);
      vVar2 = *pvVar7;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](write,(size_type)curr_arr);
      *pvVar7 = vVar2;
      curr_arr = (ValueVector *)
                 ((long)&(curr_arr->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start + 1);
    }
  }
  _Var4._M_node = next_run._M_node;
  pRVar5 = std::_List_iterator<RunInfo>::operator->((_List_iterator<RunInfo> *)&this_local);
  pRVar5->array_index = (size_t)_Var4._M_node;
  return;
}

Assistant:

void BlindMerge(std::array<ValueVector *, 2> &arrs, ValueVector &write,
                    typename std::list<RunInfo>::iterator cur_run, size_t arr_index) {
        auto next_run = std::next(cur_run, 1);
        size_t one = cur_run->elem_index,
                two = next_run->elem_index,
                k = cur_run->elem_index;
        ValueVector &curr_arr = *arrs[cur_run->array_index];
        ValueVector &next_arr = *arrs[next_run->array_index];

        while ((one - cur_run->elem_index) < cur_run->run_size &&
               (two - next_run->elem_index) < next_run->run_size) {

            if (curr_arr[one] < next_arr[two]) {
                write[k] = curr_arr[one];
                one++;
            } else {
                write[k] = next_arr[two];
                two++;
            }
            k++;
        }
        // if both runs don't have the same size, copy the remaining elements over
        if ((one - cur_run->elem_index) < cur_run->run_size) {
            for (size_t i = (one - cur_run->elem_index); i < cur_run->run_size; i++) {
                write[k] = curr_arr[i + cur_run->elem_index];
                k++;
            }
        } else {
            for (size_t i = (two - next_run->elem_index); i < next_run->run_size; i++) {
                write[k] = next_arr[i + next_run->elem_index];
                k++;
            }
        }
        cur_run->array_index = arr_index;
    }